

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O1

void DiffTestRecurse<Blob<128>,Blob<160>>
               (pfHash hash,Blob<128> *k1,Blob<128> *k2,Blob<160> *h1,Blob<160> *h2,int start,
               int bitsleft,vector<Blob<128>,_std::allocator<Blob<128>_>_> *diffs)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Blob<128> t;
  
  if (start < 0x80) {
    do {
      flipbit(k2,0x10,start);
      (*hash)(k2,0x10,0,h2);
      if (h1->bytes[0] == h2->bytes[0]) {
        uVar1 = 0;
        do {
          uVar2 = uVar1;
          if (uVar2 == 0x13) break;
          uVar1 = uVar2 + 1;
        } while (h1->bytes[uVar2 + 1] == h2->bytes[uVar2 + 1]);
        if (0x12 < uVar2) {
          uVar3 = *(uint *)k2->bytes ^ *(uint *)k1->bytes;
          uVar4 = *(uint *)(k2->bytes + 4) ^ *(uint *)(k1->bytes + 4);
          uVar5 = *(uint *)(k2->bytes + 8) ^ *(uint *)(k1->bytes + 8);
          uVar6 = *(uint *)(k2->bytes + 0xc) ^ *(uint *)(k1->bytes + 0xc);
          t.bytes[4] = (char)uVar4;
          t.bytes[5] = (char)(uVar4 >> 8);
          t.bytes[6] = (char)(uVar4 >> 0x10);
          t.bytes[7] = (char)(uVar4 >> 0x18);
          t.bytes[0] = (char)uVar3;
          t.bytes[1] = (char)(uVar3 >> 8);
          t.bytes[2] = (char)(uVar3 >> 0x10);
          t.bytes[3] = (char)(uVar3 >> 0x18);
          t.bytes[0xc] = (char)uVar6;
          t.bytes[0xd] = (char)(uVar6 >> 8);
          t.bytes[0xe] = (char)(uVar6 >> 0x10);
          t.bytes[0xf] = (char)(uVar6 >> 0x18);
          t.bytes[8] = (char)uVar5;
          t.bytes[9] = (char)(uVar5 >> 8);
          t.bytes[10] = (char)(uVar5 >> 0x10);
          t.bytes[0xb] = (char)(uVar5 >> 0x18);
          std::vector<Blob<128>,std::allocator<Blob<128>>>::emplace_back<Blob<128>>
                    ((vector<Blob<128>,std::allocator<Blob<128>>> *)diffs,&t);
        }
      }
      if (bitsleft + -1 != 0) {
        DiffTestRecurse<Blob<128>,Blob<160>>(hash,k1,k2,h1,h2,start + 1,bitsleft + -1,diffs);
      }
      flipbit(k2,0x10,start);
      start = start + 1;
    } while (start != 0x80);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}